

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O0

Vec_Int_t *
Acb_FindSupport(sat_solver *pSat,int iFirstDiv,Vec_Int_t *vWeights,Vec_Int_t *vSuppStart,int TimeOut
               )

{
  uint uVar1;
  abctime aVar2;
  Vec_Int_t *vSupp_00;
  Vec_Int_t *t;
  int Iter;
  int Cost;
  int CostBest;
  Vec_Int_t *vTemp;
  Vec_Int_t *vSupp;
  Vec_Int_t *vSuppBest;
  Vec_Wrd_t *pVStack_40;
  int nPats;
  Vec_Wrd_t *vPats;
  abctime clkLimit;
  Vec_Int_t *pVStack_28;
  int TimeOut_local;
  Vec_Int_t *vSuppStart_local;
  Vec_Int_t *vWeights_local;
  sat_solver *psStack_10;
  int iFirstDiv_local;
  sat_solver *pSat_local;
  
  clkLimit._4_4_ = TimeOut;
  pVStack_28 = vSuppStart;
  vSuppStart_local = vWeights;
  vWeights_local._4_4_ = iFirstDiv;
  psStack_10 = pSat;
  aVar2 = Abc_Clock();
  vPats = (Vec_Wrd_t *)((long)TimeOut * 1000000 + aVar2);
  pVStack_40 = (Vec_Wrd_t *)0x0;
  vSuppBest._4_4_ = 0;
  Iter = Acb_ComputeSuppCost(pVStack_28,vSuppStart_local,vWeights_local._4_4_);
  vSupp = Vec_IntDup(pVStack_28);
  printf("Starting cost = %d.\n",(ulong)(uint)Iter);
  t._4_4_ = 0;
  do {
    if (499 < (int)t._4_4_) {
LAB_00437b55:
      if (pVStack_40 != (Vec_Wrd_t *)0x0) {
        Acb_FindReplace(psStack_10,vWeights_local._4_4_,vSuppStart_local,pVStack_40,vSuppBest._4_4_,
                        vSupp);
      }
      Vec_WrdFreeP(&stack0xffffffffffffffc0);
      return vSupp;
    }
    aVar2 = Abc_Clock();
    if ((long)vPats < aVar2) {
      printf("Timeout after %d sec.\n",(ulong)clkLimit._4_4_);
      goto LAB_00437b55;
    }
    if (t._4_4_ == 0) {
      vTemp = Acb_FindSupportStart
                        (psStack_10,vWeights_local._4_4_,vSuppStart_local,&stack0xffffffffffffffc0,
                         (int *)((long)&vSuppBest + 4));
    }
    else {
      vTemp = Acb_FindSupportNext(psStack_10,vWeights_local._4_4_,vSuppStart_local,pVStack_40,
                                  (int *)((long)&vSuppBest + 4));
    }
    if (vTemp == (Vec_Int_t *)0x0) goto LAB_00437b55;
    vSupp_00 = Acb_FindSupportMin(psStack_10,vWeights_local._4_4_,pVStack_40,
                                  (int *)((long)&vSuppBest + 4),vTemp);
    Vec_IntFree(vTemp);
    if (vSupp_00 == (Vec_Int_t *)0x0) goto LAB_00437b55;
    uVar1 = Acb_ComputeSuppCost(vSupp_00,vSuppStart_local,vWeights_local._4_4_);
    vTemp = vSupp_00;
    if ((int)uVar1 < Iter) {
      vTemp = vSupp;
      printf("Iter %4d:  Next cost = %5d.  ",(ulong)t._4_4_,(ulong)uVar1);
      printf("Updating best solution.\n");
      Iter = uVar1;
      vSupp = vSupp_00;
    }
    Vec_IntFree(vTemp);
    t._4_4_ = t._4_4_ + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Acb_FindSupport( sat_solver * pSat, int iFirstDiv, Vec_Int_t * vWeights, Vec_Int_t * vSuppStart, int TimeOut )
{
    abctime clkLimit = TimeOut * CLOCKS_PER_SEC + Abc_Clock();
    Vec_Wrd_t * vPats = NULL;
    int nPats = 0;
    Vec_Int_t * vSuppBest, * vSupp, * vTemp;
    int CostBest, Cost;
    int Iter;

    // find initial best
    CostBest = Acb_ComputeSuppCost( vSuppStart, vWeights, iFirstDiv );
    vSuppBest = Vec_IntDup( vSuppStart );
    printf( "Starting cost = %d.\n", CostBest );

    // iteratively find the one with the most ones in the uncovered rows
    for ( Iter = 0; Iter < 500; Iter++ )
    {
        if ( Abc_Clock() > clkLimit )
        {
            printf( "Timeout after %d sec.\n", TimeOut );
            break;
        }
        if ( Iter == 0 )
            vSupp = Acb_FindSupportStart( pSat, iFirstDiv, vWeights, &vPats, &nPats );
        else
            vSupp = Acb_FindSupportNext( pSat, iFirstDiv, vWeights, vPats, &nPats );
        if ( vSupp == NULL )
            break;
        vSupp = Acb_FindSupportMin( pSat, iFirstDiv, vPats, &nPats, vTemp = vSupp );
        Vec_IntFree( vTemp );
        if ( vSupp == NULL )
            break;
        Cost = Acb_ComputeSuppCost( vSupp, vWeights, iFirstDiv );
        //Acb_PrintPatterns( vPats, nPats, vWeights );
        if ( CostBest > Cost )
        {
            CostBest = Cost;
            ABC_SWAP( Vec_Int_t *, vSuppBest, vSupp );
            printf( "Iter %4d:  Next cost = %5d.  ", Iter, Cost );
            printf( "Updating best solution.\n" );
        }
        Vec_IntFree( vSupp );
    }
    if ( vPats )
        Acb_FindReplace( pSat, iFirstDiv, vWeights, vPats, nPats, vSuppBest );
    //printf( "Number of patterns = %d.\n", nPats );
    Vec_WrdFreeP( &vPats );
    return vSuppBest;
}